

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vtls.c
# Opt level: O3

_Bool Curl_ssl_getsessionid(connectdata *conn,void **ssl_sessionid,size_t *idsize,int sockindex)

{
  Curl_easy *pCVar1;
  Curl_share *pCVar2;
  curl_ssl_session *pcVar3;
  char *second;
  long lVar4;
  proxy_info *ppVar5;
  _Bool _Var6;
  int iVar7;
  ssl_primary_config *data;
  int iVar8;
  long *plVar9;
  ulong uVar10;
  char *first;
  long lVar11;
  
  pCVar1 = conn->data;
  if ((conn->http_proxy).proxytype == CURLPROXY_HTTPS) {
    if ((conn->bits).proxy_ssl_connected[sockindex] == true) {
      data = &conn->ssl_config;
      ppVar5 = (proxy_info *)&conn->host;
      iVar8 = conn->remote_port;
    }
    else {
      data = &conn->proxy_ssl_config;
      ppVar5 = &conn->http_proxy;
      iVar8 = (int)conn->port;
    }
    first = (ppVar5->host).name;
    *ssl_sessionid = (void *)0x0;
    if (conn->proxy_ssl[conn->sock[1] != -1].state != ssl_connection_complete) {
      if ((pCVar1->set).proxy_ssl.primary.sessionid == false) {
        return true;
      }
      goto LAB_0055a300;
    }
  }
  else {
    data = &conn->ssl_config;
    first = (conn->host).name;
    iVar8 = conn->remote_port;
    *ssl_sessionid = (void *)0x0;
  }
  if ((pCVar1->set).ssl.primary.sessionid != true) {
    return true;
  }
LAB_0055a300:
  pCVar2 = pCVar1->share;
  if ((pCVar2 == (Curl_share *)0x0) || ((pCVar2->specifier & 0x10) == 0)) {
    plVar9 = &(pCVar1->state).sessionage;
  }
  else {
    plVar9 = &pCVar2->sessionage;
  }
  if ((pCVar1->set).general_ssl.max_ssl_sessions != 0) {
    lVar11 = 0x38;
    uVar10 = 0;
    do {
      pcVar3 = (pCVar1->state).session;
      if ((*(long *)((long)pcVar3 + lVar11 + -0x20) != 0) &&
         (iVar7 = Curl_strcasecompare(first,*(char **)((long)pcVar3 + lVar11 + -0x38)), iVar7 != 0))
      {
        second = *(char **)((long)pcVar3 + lVar11 + -0x30);
        if ((conn->bits).conn_to_host == false) {
          if (second == (char *)0x0) goto LAB_0055a3a3;
        }
        else if ((second != (char *)0x0) &&
                (iVar7 = Curl_strcasecompare((conn->conn_to_host).name,second), iVar7 != 0)) {
LAB_0055a3a3:
          iVar7 = *(int *)((long)pcVar3 + lVar11 + -4);
          if ((conn->bits).conn_to_port == false) {
            if (iVar7 == -1) goto LAB_0055a3c7;
          }
          else if ((iVar7 != -1) && (conn->conn_to_port == iVar7)) {
LAB_0055a3c7:
            if ((iVar8 == *(int *)((long)pcVar3 + lVar11 + -8)) &&
               ((iVar7 = Curl_strcasecompare(conn->handler->scheme,
                                             *(char **)((long)pcVar3 + lVar11 + -0x28)), iVar7 != 0
                && (_Var6 = Curl_ssl_config_matches
                                      (data,(ssl_primary_config *)((long)&pcVar3->name + lVar11)),
                   _Var6)))) {
              lVar4 = *plVar9;
              *plVar9 = lVar4 + 1;
              *(long *)((long)pcVar3 + lVar11 + -0x10) = lVar4 + 1;
              *ssl_sessionid = *(void **)((long)pcVar3 + lVar11 + -0x20);
              if (idsize != (size_t *)0x0) {
                *idsize = *(size_t *)((long)pcVar3 + lVar11 + -0x18);
              }
              return false;
            }
          }
        }
      }
      uVar10 = uVar10 + 1;
      lVar11 = lVar11 + 0x88;
    } while (uVar10 < (pCVar1->set).general_ssl.max_ssl_sessions);
  }
  return true;
}

Assistant:

bool Curl_ssl_getsessionid(struct connectdata *conn,
                           void **ssl_sessionid,
                           size_t *idsize, /* set 0 if unknown */
                           int sockindex)
{
  struct curl_ssl_session *check;
  struct Curl_easy *data = conn->data;
  size_t i;
  long *general_age;
  bool no_match = TRUE;

  const bool isProxy = CONNECT_PROXY_SSL();
  struct ssl_primary_config * const ssl_config = isProxy ?
    &conn->proxy_ssl_config :
    &conn->ssl_config;
  const char * const name = isProxy ? conn->http_proxy.host.name :
    conn->host.name;
  int port = isProxy ? (int)conn->port : conn->remote_port;
  *ssl_sessionid = NULL;

  DEBUGASSERT(SSL_SET_OPTION(primary.sessionid));

  if(!SSL_SET_OPTION(primary.sessionid))
    /* session ID re-use is disabled */
    return TRUE;

  /* Lock if shared */
  if(SSLSESSION_SHARED(data))
    general_age = &data->share->sessionage;
  else
    general_age = &data->state.sessionage;

  for(i = 0; i < data->set.general_ssl.max_ssl_sessions; i++) {
    check = &data->state.session[i];
    if(!check->sessionid)
      /* not session ID means blank entry */
      continue;
    if(strcasecompare(name, check->name) &&
       ((!conn->bits.conn_to_host && !check->conn_to_host) ||
        (conn->bits.conn_to_host && check->conn_to_host &&
         strcasecompare(conn->conn_to_host.name, check->conn_to_host))) &&
       ((!conn->bits.conn_to_port && check->conn_to_port == -1) ||
        (conn->bits.conn_to_port && check->conn_to_port != -1 &&
         conn->conn_to_port == check->conn_to_port)) &&
       (port == check->remote_port) &&
       strcasecompare(conn->handler->scheme, check->scheme) &&
       Curl_ssl_config_matches(ssl_config, &check->ssl_config)) {
      /* yes, we have a session ID! */
      (*general_age)++;          /* increase general age */
      check->age = *general_age; /* set this as used in this age */
      *ssl_sessionid = check->sessionid;
      if(idsize)
        *idsize = check->idsize;
      no_match = FALSE;
      break;
    }
  }

  return no_match;
}